

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenBinary(BinaryenModuleRef module,BinaryenOp op,BinaryenExpressionRef left,
              BinaryenExpressionRef right)

{
  Binary *pBVar1;
  Builder local_30;
  Expression *local_28;
  BinaryenExpressionRef right_local;
  BinaryenExpressionRef left_local;
  BinaryenModuleRef pMStack_10;
  BinaryenOp op_local;
  BinaryenModuleRef module_local;
  
  local_28 = right;
  right_local = left;
  left_local._4_4_ = op;
  pMStack_10 = module;
  wasm::Builder::Builder(&local_30,module);
  pBVar1 = wasm::Builder::makeBinary(&local_30,left_local._4_4_,right_local,local_28);
  return (BinaryenExpressionRef)pBVar1;
}

Assistant:

BinaryenExpressionRef BinaryenBinary(BinaryenModuleRef module,
                                     BinaryenOp op,
                                     BinaryenExpressionRef left,
                                     BinaryenExpressionRef right) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeBinary(BinaryOp(op), (Expression*)left, (Expression*)right));
}